

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O0

void selection_filter_percent(opvar *ov,int percent)

{
  char cVar1;
  int iVar2;
  int local_1c;
  int local_18;
  int y;
  int x;
  int percent_local;
  opvar *ov_local;
  
  if (ov != (opvar *)0x0) {
    for (local_18 = 0; local_18 < 0x50; local_18 = local_18 + 1) {
      for (local_1c = 0; local_1c < 0x15; local_1c = local_1c + 1) {
        cVar1 = selection_getpoint(local_18,local_1c,ov);
        if ((cVar1 != '\0') && (iVar2 = rn2(100), percent <= iVar2)) {
          selection_setpoint(local_18,local_1c,ov,'\0');
        }
      }
    }
  }
  return;
}

Assistant:

static void selection_filter_percent(struct opvar *ov, int percent)
{
	int x, y;
	if (!ov) return;
	for (x = 0; x < COLNO; x++)
	    for (y = 0; y < ROWNO; y++)
		if (selection_getpoint(x, y, ov) && (rn2(100) >= percent))
		    selection_setpoint(x, y, ov, 0);
}